

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  void *__s1;
  stbi__write_context *s_00;
  int iVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  size_t __n;
  void *__s2;
  char *fmt;
  ulong uVar3;
  long lVar4;
  undefined4 in_register_00000034;
  uchar *d;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uVar9;
  void *pvVar10;
  bool bVar11;
  uchar header;
  uchar header_1;
  char *local_a8;
  size_t local_a0;
  ulong local_98;
  int local_8c;
  undefined8 local_88;
  ulong local_80;
  long local_78;
  void *local_70;
  long local_68;
  stbi__write_context *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  fmt = (char *)CONCAT44(in_register_00000034,x);
  local_88 = CONCAT44(in_register_0000000c,comp);
  bVar11 = (comp - 2U & 0xfffffffd) == 0;
  uVar3 = (ulong)bVar11;
  uVar7 = (uint)bVar11;
  iVar5 = comp - uVar7;
  if ((y | x) < 0) {
    iVar5 = 0;
  }
  else {
    local_a8 = fmt;
    local_70 = data;
    if (stbi_write_tga_with_rle == 0) {
      iVar5 = stbiw__outfile(s,x,0,x,y,comp,0,data,(uint)bVar11,0,"111 221 2222 11",0,0,
                             (ulong)(iVar5 < 2 | 2),0,0,0,0,0,fmt,(ulong)(uint)y,
                             (ulong)((iVar5 + uVar7) * 8),(ulong)((uint)bVar11 * 8));
    }
    else {
      d = (uchar *)0x0;
      stbiw__writef(s,fmt,0,0,(ulong)(iVar5 < 2 | 10),0,0,0,0,0,fmt,(ulong)(uint)y,
                    (ulong)((iVar5 + uVar7) * 8),(ulong)((uint)bVar11 * 8));
      if (0 < y) {
        local_8c = (int)local_88 * x;
        __n = (size_t)(int)local_88;
        local_50 = (long)x;
        local_80 = (ulong)(uint)y;
        iVar5 = (y + -1) * local_8c;
        uVar9 = local_88;
        local_a0 = __n;
        local_98 = uVar3;
        local_60 = s;
        do {
          local_48 = local_80;
          local_80 = local_80 - 1;
          local_68 = (long)iVar5;
          if (0 < (int)fmt) {
            local_40 = (long)(local_8c * (int)local_80) + (long)local_70;
            local_78 = (long)local_70 + local_68;
            local_38 = 0;
            do {
              iVar5 = (int)local_38;
              lVar6 = (long)(iVar5 * (int)uVar9);
              __s1 = (void *)(local_40 + lVar6);
              if (iVar5 < x + -1) {
                iVar1 = bcmp(__s1,(void *)((iVar5 + 1) * (int)uVar9 + local_40),__n);
                iVar5 = iVar5 + 2;
                if (iVar1 == 0) {
                  uVar8 = 2;
                  bVar11 = true;
                  if (iVar5 < (int)fmt) {
                    lVar4 = (long)iVar5;
                    pvVar10 = (void *)(local_a0 * lVar4 + local_78);
                    uVar8 = 2;
                    do {
                      lVar4 = lVar4 + 1;
                      iVar5 = bcmp(__s1,pvVar10,local_a0);
                      fmt = local_a8;
                      uVar3 = local_98;
                      bVar11 = true;
                      if (iVar5 != 0) goto LAB_00196949;
                      uVar7 = (uint)uVar8;
                      uVar2 = uVar7 + 1;
                      if (local_50 <= lVar4) break;
                      pvVar10 = (void *)((long)pvVar10 + local_a0);
                      uVar8 = (ulong)uVar2;
                    } while (uVar7 < 0x7f);
                    uVar8 = (ulong)uVar2;
                  }
                }
                else if (iVar5 < (int)fmt) {
                  lVar4 = (long)iVar5;
                  __s2 = (void *)(local_a0 * lVar4 + local_78);
                  uVar8 = 1;
                  pvVar10 = __s1;
                  do {
                    lVar4 = lVar4 + 1;
                    iVar5 = bcmp(pvVar10,__s2,local_a0);
                    if (iVar5 == 0) goto LAB_001968c4;
                    iVar5 = (int)uVar8;
                    uVar7 = iVar5 + 1;
                    uVar8 = (ulong)uVar7;
                    if (local_50 <= lVar4) break;
                    pvVar10 = (void *)((long)pvVar10 + local_a0);
                    __s2 = (void *)((long)__s2 + local_a0);
                  } while (uVar7 < 0x7f);
                  uVar8 = (ulong)(iVar5 + 2);
LAB_001968c4:
                  fmt = local_a8;
                  uVar3 = local_98;
                  bVar11 = false;
                }
                else {
                  uVar8 = 2;
                  bVar11 = false;
                }
              }
              else {
                uVar8 = 1;
                bVar11 = false;
              }
LAB_00196949:
              s_00 = local_60;
              iVar5 = (int)uVar8;
              if (bVar11) {
                header = (char)uVar8 + '\x7f';
                (*local_60->func)(local_60->context,&header,1);
                uVar9 = local_88;
                stbiw__write_pixel(s_00,(int)local_88,(int)uVar3,0,(int)__s1,d);
                __n = local_a0;
              }
              else {
                header_1 = (char)uVar8 + 0xff;
                (*local_60->func)(local_60->context,&header_1,1);
                uVar9 = local_88;
                __n = local_a0;
                local_58 = uVar8;
                if (0 < iVar5) {
                  lVar6 = lVar6 + local_78;
                  do {
                    stbiw__write_pixel(s_00,(int)uVar9,(int)uVar3,0,(int)lVar6,d);
                    lVar6 = lVar6 + __n;
                    uVar8 = uVar8 - 1;
                  } while (uVar8 != 0);
                }
                iVar5 = (int)local_58;
                fmt = local_a8;
              }
              uVar7 = iVar5 + (int)local_38;
              local_38 = (ulong)uVar7;
            } while ((int)uVar7 < (int)fmt);
          }
          iVar5 = (int)local_68 - local_8c;
        } while (1 < (long)local_48);
      }
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      for (j = y - 1; j >= 0; --j) {
          unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = (unsigned char) (len - 1);
               s->func(s->context, &header, 1);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = (unsigned char) (len - 129);
               s->func(s->context, &header, 1);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
   }
   return 1;
}